

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

uint GetFunctionRating(ExpressionContext *ctx,FunctionData *function,TypeFunction *instance,
                      ArrayView<CallArgumentData> arguments)

{
  TypeStruct *node;
  TypeStruct *node_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ArgumentData *pAVar4;
  CallArgumentData *pCVar5;
  bool_type bVar6;
  TypeUnsizedArray *pTVar7;
  TypeArray *pTVar8;
  TypeRef *pTVar9;
  TypeClass *pTVar10;
  TypeClass *pTVar11;
  TypeRef *pTVar12;
  TypeRef *lRef_2;
  FunctionValue functionValue_1;
  TypeFunction *lFunction;
  TypeClass *rClass_1;
  TypeClass *lClass_1;
  TypeClass *rClass;
  TypeClass *lClass;
  TypeRef *rRef_1;
  TypeRef *lRef_1;
  TypeArray *rArray_1;
  TypeUnsizedArray *lArray_1;
  TypeRef *rRef;
  TypeRef *lRef;
  TypeArray *rArray;
  TypeUnsizedArray *lArray;
  FunctionValue functionValue;
  TypeFunction *target;
  TypeBase *actualType;
  CallArgumentData *actualArgument;
  TypeBase *expectedType;
  ArgumentData *expectedArgument;
  TypeHandle *argType;
  uint i;
  uint rating;
  TypeFunction *instance_local;
  FunctionData *function_local;
  ExpressionContext *ctx_local;
  ArrayView<CallArgumentData> arguments_local;
  
  ctx_local = (ExpressionContext *)arguments.data;
  arguments_local.data._0_4_ = arguments.count;
  uVar2 = SmallArray<ArgumentData,_4U>::size(&function->arguments);
  uVar3 = ArrayView<CallArgumentData>::size((ArrayView<CallArgumentData> *)&ctx_local);
  if (uVar2 == uVar3) {
    argType._4_4_ = 0;
    argType._0_4_ = 0;
    for (expectedArgument = (ArgumentData *)(instance->arguments).head;
        expectedArgument != (ArgumentData *)0x0;
        expectedArgument = *(ArgumentData **)&expectedArgument->isExplicit) {
      pAVar4 = SmallArray<ArgumentData,_4U>::operator[](&function->arguments,(uint)argType);
      node = (TypeStruct *)expectedArgument->source;
      pCVar5 = ArrayView<CallArgumentData>::operator[]
                         ((ArrayView<CallArgumentData> *)&ctx_local,(uint)argType);
      node_00 = (TypeStruct *)pCVar5->type;
      if (node != node_00) {
        if (node_00 == (TypeStruct *)ctx->typeNullPtr) {
          bVar1 = isType<TypeRef>((TypeBase *)node);
          if (((!bVar1) && (bVar1 = isType<TypeUnsizedArray>((TypeBase *)node), !bVar1)) &&
             (bVar1 = isType<TypeFunction>((TypeBase *)node), !bVar1)) {
            if ((node != ctx->typeAutoRef) && (node != ctx->typeAutoArray)) goto LAB_00247511;
            argType._4_4_ = argType._4_4_ + 5;
          }
        }
        else {
LAB_00247511:
          if (((node->super_TypeBase).isGeneric & 1U) == 0) {
            if ((pAVar4->isExplicit & 1U) == 0) {
              bVar1 = isType<TypeUnsizedArray>((TypeBase *)node);
              if ((bVar1) && (bVar1 = isType<TypeArray>((TypeBase *)node_00), bVar1)) {
                pTVar7 = getType<TypeUnsizedArray>((TypeBase *)node);
                pTVar8 = getType<TypeArray>((TypeBase *)node_00);
                if (pTVar7->subType == pTVar8->subType) {
                  argType._4_4_ = argType._4_4_ + 2;
                  goto LAB_002479e3;
                }
              }
              if ((node == ctx->typeAutoArray) &&
                 ((bVar1 = isType<TypeArray>((TypeBase *)node_00), bVar1 ||
                  (bVar1 = isType<TypeUnsizedArray>((TypeBase *)node_00), bVar1)))) {
                argType._4_4_ = argType._4_4_ + 5;
              }
              else {
                bVar1 = isType<TypeRef>((TypeBase *)node);
                if ((bVar1) && (bVar1 = isType<TypeRef>((TypeBase *)node_00), bVar1)) {
                  pTVar12 = getType<TypeRef>((TypeBase *)node);
                  pTVar9 = getType<TypeRef>((TypeBase *)node_00);
                  bVar1 = isType<TypeUnsizedArray>(pTVar12->subType);
                  if ((bVar1) && (bVar1 = isType<TypeArray>(pTVar9->subType), bVar1)) {
                    pTVar7 = getType<TypeUnsizedArray>(pTVar12->subType);
                    pTVar8 = getType<TypeArray>(pTVar9->subType);
                    if (pTVar7->subType == pTVar8->subType) {
                      argType._4_4_ = argType._4_4_ + 10;
                      goto LAB_002479e3;
                    }
                  }
                }
                bVar1 = isType<TypeRef>((TypeBase *)node);
                if ((bVar1) && (bVar1 = isType<TypeRef>((TypeBase *)node_00), bVar1)) {
                  pTVar12 = getType<TypeRef>((TypeBase *)node);
                  pTVar9 = getType<TypeRef>((TypeBase *)node_00);
                  bVar1 = isType<TypeClass>(pTVar12->subType);
                  if ((bVar1) && (bVar1 = isType<TypeClass>(pTVar9->subType), bVar1)) {
                    pTVar10 = getType<TypeClass>(pTVar12->subType);
                    pTVar11 = getType<TypeClass>(pTVar9->subType);
                    bVar1 = anon_unknown.dwarf_e7629::IsDerivedFrom(pTVar11,pTVar10);
                    if (bVar1) {
                      argType._4_4_ = argType._4_4_ + 5;
                    }
                    else {
                      bVar1 = anon_unknown.dwarf_e7629::IsDerivedFrom(pTVar10,pTVar11);
                      if (!bVar1) goto LAB_0024781a;
                      argType._4_4_ = argType._4_4_ + 10;
                    }
                    goto LAB_002479e3;
                  }
                }
LAB_0024781a:
                bVar1 = isType<TypeClass>((TypeBase *)node);
                if ((bVar1) && (bVar1 = isType<TypeClass>((TypeBase *)node_00), bVar1)) {
                  pTVar10 = getType<TypeClass>((TypeBase *)node);
                  pTVar11 = getType<TypeClass>((TypeBase *)node_00);
                  bVar1 = anon_unknown.dwarf_e7629::IsDerivedFrom(pTVar11,pTVar10);
                  if (bVar1) {
                    argType._4_4_ = argType._4_4_ + 5;
                    goto LAB_002479e3;
                  }
                }
                bVar1 = isType<TypeFunction>((TypeBase *)node);
                if (bVar1) {
                  functionValue_1.context = (ExprBase *)getType<TypeFunction>((TypeBase *)node);
                  if ((pCVar5->value == (ExprBase *)0x0) ||
                     ((bVar1 = isType<TypeFunction>(pCVar5->type), !bVar1 &&
                      (bVar1 = isType<TypeFunctionSet>(pCVar5->type), !bVar1)))) {
                    return 0xffffffff;
                  }
                  GetFunctionForType((FunctionValue *)&lRef_2,ctx,pCVar5->value->source,
                                     pCVar5->value,(TypeFunction *)functionValue_1.context);
                  bVar6 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)&lRef_2)
                  ;
                  if (bVar6 == 0) {
                    return 0xffffffff;
                  }
                }
                else {
                  bVar1 = isType<TypeRef>((TypeBase *)node);
                  if ((bVar1) &&
                     (pTVar12 = getType<TypeRef>((TypeBase *)node),
                     (TypeStruct *)pTVar12->subType == node_00)) {
                    argType._4_4_ = argType._4_4_ + 5;
                  }
                  else if ((node == ctx->typeAutoRef) &&
                          (bVar1 = isType<TypeRef>((TypeBase *)node_00), bVar1)) {
                    argType._4_4_ = argType._4_4_ + 5;
                  }
                  else if (node == ctx->typeAutoRef) {
                    argType._4_4_ = argType._4_4_ + 10;
                  }
                  else {
                    bVar1 = ExpressionContext::IsNumericType(ctx,(TypeBase *)node);
                    if ((!bVar1) ||
                       (bVar1 = ExpressionContext::IsNumericType(ctx,(TypeBase *)node_00), !bVar1))
                    {
                      return 0xffffffff;
                    }
                    argType._4_4_ = argType._4_4_ + 1;
                  }
                }
              }
            }
            else {
              functionValue.context = (ExprBase *)getType<TypeFunction>((TypeBase *)node);
              if ((((TypeFunction *)functionValue.context == (TypeFunction *)0x0) ||
                  (pCVar5->value == (ExprBase *)0x0)) ||
                 ((bVar1 = isType<TypeFunction>(pCVar5->type), !bVar1 &&
                  (bVar1 = isType<TypeFunctionSet>(pCVar5->type), !bVar1)))) {
                return 0xffffffff;
              }
              GetFunctionForType((FunctionValue *)&lArray,ctx,pCVar5->value->source,pCVar5->value,
                                 (TypeFunction *)functionValue.context);
              bVar6 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)&lArray);
              if (bVar6 == 0) {
                return 0xffffffff;
              }
            }
          }
        }
      }
LAB_002479e3:
      argType._0_4_ = (uint)argType + 1;
    }
    arguments_local._12_4_ = argType._4_4_;
  }
  else {
    arguments_local._12_4_ = 0xffffffff;
  }
  return arguments_local._12_4_;
}

Assistant:

unsigned GetFunctionRating(ExpressionContext &ctx, FunctionData *function, TypeFunction *instance, ArrayView<CallArgumentData> arguments)
{
	if(function->arguments.size() != arguments.size())
		return ~0u;	// Definitely, this isn't the function we are trying to call. Argument count does not match.

	unsigned rating = 0;

	unsigned i = 0;

	for(TypeHandle *argType = instance->arguments.head; argType; argType = argType->next, i++)
	{
		ArgumentData &expectedArgument = function->arguments[i];
		TypeBase *expectedType = argType->type;

		CallArgumentData &actualArgument = arguments[i];
		TypeBase *actualType = actualArgument.type;

		if(expectedType != actualType)
		{
			if(actualType == ctx.typeNullPtr)
			{
				// nullptr is convertable to T ref, T[] and function pointers
				if(isType<TypeRef>(expectedType) || isType<TypeUnsizedArray>(expectedType) || isType<TypeFunction>(expectedType))
					continue;

				// nullptr is also convertable to auto ref and auto[], but it has the same rating as type ref -> auto ref and array -> auto[] defined below
				if(expectedType == ctx.typeAutoRef || expectedType == ctx.typeAutoArray)
				{
					rating += 5;
					continue;
				}
			}

			// Generic function argument
			if(expectedType->isGeneric)
				continue;

			if(expectedArgument.isExplicit)
			{
				if(TypeFunction *target = getType<TypeFunction>(expectedType))
				{
					if(actualArgument.value && (isType<TypeFunction>(actualArgument.type) || isType<TypeFunctionSet>(actualArgument.type)))
					{
						if(FunctionValue functionValue = GetFunctionForType(ctx, actualArgument.value->source, actualArgument.value, target))
							continue;
					}
				}

				return ~0u;
			}

			// array -> class (unsized array)
			if(isType<TypeUnsizedArray>(expectedType) && isType<TypeArray>(actualType))
			{
				TypeUnsizedArray *lArray = getType<TypeUnsizedArray>(expectedType);
				TypeArray *rArray = getType<TypeArray>(actualType);

				if(lArray->subType == rArray->subType)
				{
					rating += 2;
					continue;
				}
			}

			// array -> auto[]
			if(expectedType == ctx.typeAutoArray && (isType<TypeArray>(actualType) || isType<TypeUnsizedArray>(actualType)))
			{
				rating += 5;
				continue;
			}

			// array[N] ref -> array[] -> array[] ref
			if(isType<TypeRef>(expectedType) && isType<TypeRef>(actualType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);
				TypeRef *rRef = getType<TypeRef>(actualType);

				if(isType<TypeUnsizedArray>(lRef->subType) && isType<TypeArray>(rRef->subType))
				{
					TypeUnsizedArray *lArray = getType<TypeUnsizedArray>(lRef->subType);
					TypeArray *rArray = getType<TypeArray>(rRef->subType);

					if(lArray->subType == rArray->subType)
					{
						rating += 10;
						continue;
					}
				}
			}

			// derived ref -> base ref
			// base ref -> derived ref
			if(isType<TypeRef>(expectedType) && isType<TypeRef>(actualType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);
				TypeRef *rRef = getType<TypeRef>(actualType);

				if(isType<TypeClass>(lRef->subType) && isType<TypeClass>(rRef->subType))
				{
					TypeClass *lClass = getType<TypeClass>(lRef->subType);
					TypeClass *rClass = getType<TypeClass>(rRef->subType);

					if(IsDerivedFrom(rClass, lClass))
					{
						rating += 5;
						continue;
					}

					if(IsDerivedFrom(lClass, rClass))
					{
						rating += 10;
						continue;
					}
				}
			}

			if(isType<TypeClass>(expectedType) && isType<TypeClass>(actualType))
			{
				TypeClass *lClass = getType<TypeClass>(expectedType);
				TypeClass *rClass = getType<TypeClass>(actualType);

				if(IsDerivedFrom(rClass, lClass))
				{
					rating += 5;
					continue;
				}
			}

			if(isType<TypeFunction>(expectedType))
			{
				TypeFunction *lFunction = getType<TypeFunction>(expectedType);

				if(actualArgument.value && (isType<TypeFunction>(actualArgument.type) || isType<TypeFunctionSet>(actualArgument.type)))
				{
					if(FunctionValue functionValue = GetFunctionForType(ctx, actualArgument.value->source, actualArgument.value, lFunction))
						continue;
				}
				
				return ~0u;
			}

			// type -> type ref
			if(isType<TypeRef>(expectedType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);

				if(lRef->subType == actualType)
				{
					rating += 5;
					continue;
				}
			}

			// type ref -> auto ref
			if(expectedType == ctx.typeAutoRef && isType<TypeRef>(actualType))
			{
				rating += 5;
				continue;
			}

			// type -> type ref -> auto ref
			if(expectedType == ctx.typeAutoRef)
			{
				rating += 10;
				continue;
			}

			// numeric -> numeric
			if(ctx.IsNumericType(expectedType) && ctx.IsNumericType(actualType))
			{
				rating += 1;
				continue;
			}

			return ~0u;
		}
	}

	return rating;
}